

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::convertToXYZFloat
               (float *out,float *whitepoint,float *in,uint w,uint h,LodePNGState *state)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  LodePNGICCCurve *curve;
  float fVar6;
  uint local_180;
  LodePNGICC icc;
  
  icc.trc[0].lut = (float *)0x0;
  icc.trc[0].lut_size = 0;
  icc.trc[1].lut = (float *)0x0;
  icc.trc[1].lut_size = 0;
  icc.trc[2].lut = (float *)0x0;
  icc.trc[2].lut_size = 0;
  if ((state->info_png).iccp_defined == 0) {
    local_180 = 0;
  }
  else {
    uVar1 = parseICC(&icc,(state->info_png).iccp_profile,(ulong)(state->info_png).iccp_profile_size)
    ;
    if (uVar1 != 0) {
      uVar1 = 1;
      goto LAB_0011a3df;
    }
    local_180 = validateICC(&icc);
  }
  uVar5 = (ulong)(h * w);
  for (lVar2 = 0; uVar5 << 4 != lVar2; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)out + lVar2) = *(undefined4 *)((long)in + lVar2);
  }
  if (local_180 == 0) {
    if (((state->info_png).gama_defined == 0) || ((state->info_png).srgb_defined != 0)) {
      pfVar3 = out;
      for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
          fVar6 = in[lVar2];
          if (0.04045 <= fVar6) {
            fVar6 = lodepng_powf((fVar6 + 0.055) / 1.055,2.4);
          }
          else {
            fVar6 = fVar6 / 12.92;
          }
          pfVar3[lVar2] = fVar6;
        }
        in = in + 4;
        pfVar3 = pfVar3 + 4;
      }
    }
    else {
      uVar1 = (state->info_png).gama_gamma;
      if (uVar1 != 100000) {
        pfVar3 = out;
        for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
          for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
            fVar6 = in[lVar2];
            if (0.0 < fVar6) {
              fVar6 = lodepng_powf(fVar6,100000.0 / (float)uVar1);
            }
            pfVar3[lVar2] = fVar6;
          }
          in = in + 4;
          pfVar3 = pfVar3 + 4;
        }
      }
    }
  }
  else {
    pfVar3 = out;
    for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      curve = icc.trc;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        fVar6 = iccForwardTRC(curve,in[lVar2]);
        pfVar3[lVar2] = fVar6;
        curve = curve + 1;
      }
      in = in + 4;
      pfVar3 = pfVar3 + 4;
    }
  }
  convertToXYZ_chrm(out,w,h,&state->info_png,local_180,&icc,whitepoint);
  uVar1 = 0;
LAB_0011a3df:
  lodepng_icc_cleanup(&icc);
  return uVar1;
}

Assistant:

unsigned convertToXYZFloat(float* out, float whitepoint[3], const float* in,
                           unsigned w, unsigned h, const LodePNGState* state) {
  unsigned error = 0;
  const LodePNGInfo* info = &state->info_png;

  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }
  /* Input is floating point, so lookup table cannot be used, but it's ensured to
  use float pow, not the slower double pow. */
  convertToXYZ_gamma(out, in, w, h, info, use_icc, &icc);
  convertToXYZ_chrm(out, w, h, info, use_icc, &icc, whitepoint);

cleanup:
  lodepng_icc_cleanup(&icc);
  return error;
}